

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_exclude_entry(archive *_a,wchar_t flag,archive_entry *entry)

{
  int iVar1;
  wchar_t magic_test;
  wchar_t r;
  archive_match *a;
  archive_entry *entry_local;
  wchar_t flag_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_time_include_entry");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else if (entry == (archive_entry *)0x0) {
    archive_set_error(_a,0x16,"entry is NULL");
    _a_local._4_4_ = L'\xffffffe7';
  }
  else {
    _a_local._4_4_ = validate_time_flag(_a,flag,"archive_match_exclude_entry");
    if (_a_local._4_4_ == L'\0') {
      _a_local._4_4_ = add_entry((archive_match *)_a,flag,entry);
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_match_exclude_entry(struct archive *_a, int flag,
    struct archive_entry *entry)
{
	struct archive_match *a;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_time_include_entry");
	a = (struct archive_match *)_a;

	if (entry == NULL) {
		archive_set_error(&(a->archive), EINVAL, "entry is NULL");
		return (ARCHIVE_FAILED);
	}
	r = validate_time_flag(_a, flag, "archive_match_exclude_entry");
	if (r != ARCHIVE_OK)
		return (r);
	return (add_entry(a, flag, entry));
}